

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat4 * dja::operator*(mat4 *__return_storage_ptr__,float_t s,mat4 *m)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  
  uVar1 = m->m[0].x;
  uVar9 = m->m[0].y;
  uVar2 = m->m[0].z;
  uVar10 = m->m[0].w;
  uVar3 = m->m[1].x;
  uVar11 = m->m[1].y;
  uVar4 = m->m[1].z;
  uVar12 = m->m[1].w;
  uVar5 = m->m[2].x;
  uVar13 = m->m[2].y;
  uVar6 = m->m[2].z;
  uVar14 = m->m[2].w;
  uVar7 = m->m[3].x;
  uVar15 = m->m[3].y;
  uVar8 = m->m[3].z;
  uVar16 = m->m[3].w;
  __return_storage_ptr__->m[0].x = (float)uVar1 * s;
  __return_storage_ptr__->m[0].y = (float)uVar9 * s;
  __return_storage_ptr__->m[0].z = (float)uVar2 * s;
  __return_storage_ptr__->m[0].w = (float)uVar10 * s;
  __return_storage_ptr__->m[1].x = (float)uVar3 * s;
  __return_storage_ptr__->m[1].y = (float)uVar11 * s;
  __return_storage_ptr__->m[1].z = (float)uVar4 * s;
  __return_storage_ptr__->m[1].w = (float)uVar12 * s;
  __return_storage_ptr__->m[2].x = (float)uVar5 * s;
  __return_storage_ptr__->m[2].y = (float)uVar13 * s;
  __return_storage_ptr__->m[2].z = (float)uVar6 * s;
  __return_storage_ptr__->m[2].w = (float)uVar14 * s;
  __return_storage_ptr__->m[3].x = (float)uVar7 * s;
  __return_storage_ptr__->m[3].y = (float)uVar15 * s;
  __return_storage_ptr__->m[3].z = (float)uVar8 * s;
  __return_storage_ptr__->m[3].w = (float)uVar16 * s;
  return __return_storage_ptr__;
}

Assistant:

mat4 operator*(const float_t s, const mat4& m)
{
    return mat4(s * m[0], s * m[1], s * m[2], s * m[3]);
}